

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O0

UINT8 device_start_k053260(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  k053260_state *device;
  int local_30;
  UINT32 local_2c;
  int i;
  UINT32 rate;
  k053260_state *info;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  device = (k053260_state *)calloc(1,0xe8);
  if (device == (k053260_state *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    device->rom = (UINT8 *)0x0;
    device->rom_size = 0;
    device->rom_mask = 0;
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      KDSC_voice_start((KDSC_Voice *)((long)device->voice + (long)local_30 * 0x28),device);
    }
    local_2c = cfg->clock >> 6;
    if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (local_2c < cfg->smplRate)))) {
      local_2c = cfg->smplRate;
    }
    RC_SET_RATIO(&device->cycleCntr,cfg->clock,local_2c);
    k053260_set_mute_mask(device,0);
    device->_devData = (DEV_DATA)device;
    INIT_DEVINF(retDevInf,(DEV_DATA *)device,local_2c,&devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_k053260(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	k053260_state *info;
	UINT32 rate;
	int i;

	info = (k053260_state *)calloc(1, sizeof(k053260_state));
	if (info == NULL)
		return 0xFF;

	info->rom = NULL;
	info->rom_size = 0x00;
	info->rom_mask = 0x00;

	for (i = 0; i < 4; i++)
		KDSC_voice_start(&info->voice[i], info);

	rate = cfg->clock / CLOCKS_PER_SAMPLE;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);

	RC_SET_RATIO(&info->cycleCntr, cfg->clock, rate);

	k053260_set_mute_mask(info, 0x00);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, rate, &devDef);

	return 0x00;
}